

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

sexp_conflict
sexp_env_push_op(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,
                sexp_conflict name,sexp_conflict value)

{
  int iVar1;
  sexp psVar2;
  sexp_conflict psVar3;
  undefined8 uStack_50;
  sexp_conflict local_40;
  sexp_gc_var_t local_38;
  
  local_40 = (sexp_conflict)0x43e;
  if ((((ulong)env & 3) == 0) && (env->tag == 0x17)) {
    iVar1 = sexp_idp(name);
    if (iVar1 != 0) {
      local_38.var = &local_40;
      local_38.next = (ctx->value).context.saves;
      (ctx->value).context.saves = &local_38;
      psVar2 = (sexp)sexp_cons_op(ctx,0,2,name,value);
      (psVar2->value).type.slots = (env->value).type.slots;
      (env->value).type.slots = psVar2;
      (ctx->value).context.saves = local_38.next;
      return (sexp_conflict)0x43e;
    }
    uStack_50 = 7;
  }
  else {
    uStack_50 = 0x17;
    name = env;
  }
  psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,uStack_50,name);
  return psVar3;
}

Assistant:

sexp sexp_env_push_op (sexp ctx, sexp self, sexp_sint_t n, sexp env, sexp name, sexp value) {
  sexp_gc_var1(tmp);
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
  sexp_assert_type(ctx, sexp_idp, SEXP_SYMBOL, name);
  sexp_gc_preserve1(ctx, tmp);
  sexp_env_push(ctx, env, tmp, name, value);
  sexp_gc_release1(ctx);
  return SEXP_VOID;
}